

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBConstraintsInit(ClientContext *context,TableFunctionInitInput *input)

{
  bool bVar1;
  SchemaCatalogEntry *pSVar2;
  reference this;
  TableCatalogEntry *in_RSI;
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  in_RDI;
  reference_wrapper<duckdb::CatalogEntry> *entry;
  iterator __end2;
  iterator __begin2;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *__range2;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> entries;
  reference_wrapper<duckdb::SchemaCatalogEntry> *schema;
  iterator __end1;
  iterator __begin1;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *__range1;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  templated_unique_single_t result;
  vector<duckdb::ConstraintEntry,_true> *in_stack_fffffffffffffec8;
  TableCatalogEntry *in_stack_fffffffffffffed0;
  ClientContext *in_stack_fffffffffffffed8;
  pointer in_stack_fffffffffffffee0;
  __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
  local_d0;
  undefined1 *local_c8;
  reference_wrapper<duckdb::CatalogEntry> *local_b8;
  reference_wrapper<duckdb::CatalogEntry> *local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [24];
  reference_wrapper<duckdb::SchemaCatalogEntry> *local_68;
  reference_wrapper<duckdb::SchemaCatalogEntry> *local_60;
  __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
  in_stack_ffffffffffffffa8;
  
  make_uniq<duckdb::DuckDBConstraintsData>();
  Catalog::GetAllSchemas((ClientContext *)in_stack_ffffffffffffffa8._M_current);
  ::std::
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
  ::begin((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
           *)in_stack_fffffffffffffec8);
  local_60 = (reference_wrapper<duckdb::SchemaCatalogEntry> *)
             ::std::
             vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ::end((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    *)in_stack_fffffffffffffec8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                        *)in_stack_fffffffffffffed0,
                       (__normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                        *)in_stack_fffffffffffffec8);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
               ::operator*((__normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                            *)&stack0xffffffffffffffa8);
    vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::vector
              ((vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)0x1403def);
    pSVar2 = ::std::reference_wrapper<duckdb::SchemaCatalogEntry>::get(local_68);
    local_a8 = local_80;
    ::std::function<void(duckdb::CatalogEntry&)>::
    function<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0,void>
              ((function<void_(duckdb::CatalogEntry_&)> *)in_stack_fffffffffffffee0,
               (anon_class_8_1_247cb770 *)in_stack_fffffffffffffed8);
    (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
              (pSVar2,in_RSI,1,local_a0);
    ::std::function<void_(duckdb::CatalogEntry_&)>::~function
              ((function<void_(duckdb::CatalogEntry_&)> *)0x1403e67);
    local_b0 = (reference_wrapper<duckdb::CatalogEntry> *)
               ::std::
               vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
               ::begin((vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                        *)in_stack_fffffffffffffec8);
    local_b8 = (reference_wrapper<duckdb::CatalogEntry> *)
               ::std::
               vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
               ::end((vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                      *)in_stack_fffffffffffffec8);
    ::std::
    sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>
              (local_b0,local_b8);
    local_c8 = local_80;
    local_d0._M_current =
         (reference_wrapper<duckdb::CatalogEntry> *)
         ::std::
         vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
         ::begin((vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                  *)in_stack_fffffffffffffec8);
    ::std::
    vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ::end((vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           *)in_stack_fffffffffffffec8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
                          *)in_stack_fffffffffffffed0,
                         (__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
                          *)in_stack_fffffffffffffec8);
      if (!bVar1) break;
      this = __gnu_cxx::
             __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
             ::operator*(&local_d0);
      in_stack_fffffffffffffee0 =
           unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
                         *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffec8 = &in_stack_fffffffffffffee0->entries;
      in_stack_fffffffffffffed0 = in_RSI;
      ::std::reference_wrapper<duckdb::CatalogEntry>::get(this);
      in_stack_fffffffffffffed8 =
           (ClientContext *)
           CatalogEntry::Cast<duckdb::TableCatalogEntry>((CatalogEntry *)in_stack_fffffffffffffed0);
      ::std::vector<duckdb::ConstraintEntry,std::allocator<duckdb::ConstraintEntry>>::
      emplace_back<duckdb::ClientContext&,duckdb::TableCatalogEntry&>
                ((vector<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_> *)
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      __gnu_cxx::
      __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
      ::operator++(&local_d0);
    }
    vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::~vector
              ((vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)0x1403fc8);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
    ::operator++((__normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                  *)&stack0xffffffffffffffa8);
  }
  unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>,true>
  ::
  unique_ptr<duckdb::DuckDBConstraintsData,std::default_delete<std::unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>>>,void>
            ((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
              *)in_stack_fffffffffffffed0,
             (unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>_>
              *)in_stack_fffffffffffffec8);
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true>::~vector
            ((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *)0x1404015);
  unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
                 *)0x1404022);
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBConstraintsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBConstraintsData>();

	// scan all the schemas for tables and collect them
	auto schemas = Catalog::GetAllSchemas(context);

	for (auto &schema : schemas) {
		vector<reference<CatalogEntry>> entries;

		schema.get().Scan(context, CatalogType::TABLE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.type == CatalogType::TABLE_ENTRY) {
				entries.push_back(entry);
			}
		});

		sort(entries.begin(), entries.end(), [&](CatalogEntry &x, CatalogEntry &y) { return (x.name < y.name); });
		for (auto &entry : entries) {
			result->entries.emplace_back(context, entry.get().Cast<TableCatalogEntry>());
		}
	};

	return std::move(result);
}